

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.cpp
# Opt level: O0

void read_pred_weight_table(h264_stream_t *h,bs_t *b)

{
  slice_header_t *psVar1;
  sps_t *psVar2;
  uint32_t uVar3;
  int32_t iVar4;
  int iVar5;
  int local_38;
  int local_34;
  int j;
  int i;
  pps_t *pps;
  sps_t *sps;
  slice_header_t *sh;
  bs_t *b_local;
  h264_stream_t *h_local;
  
  psVar1 = h->sh;
  psVar2 = h->sps;
  uVar3 = bs_read_ue(b);
  (psVar1->pwt).luma_log2_weight_denom = uVar3;
  if (psVar2->ChromaArrayType != 0) {
    uVar3 = bs_read_ue(b);
    (psVar1->pwt).chroma_log2_weight_denom = uVar3;
  }
  for (local_34 = 0; local_34 <= psVar1->num_ref_idx_l0_active_minus1; local_34 = local_34 + 1) {
    uVar3 = bs_read_u1(b);
    (psVar1->pwt).luma_weight_l0_flag[local_34] = uVar3;
    if ((psVar1->pwt).luma_weight_l0_flag[local_34] != 0) {
      iVar4 = bs_read_se(b);
      (psVar1->pwt).luma_weight_l0[local_34] = iVar4;
      iVar4 = bs_read_se(b);
      (psVar1->pwt).luma_offset_l0[local_34] = iVar4;
    }
    if (psVar2->ChromaArrayType != 0) {
      uVar3 = bs_read_u1(b);
      (psVar1->pwt).chroma_weight_l0_flag[local_34] = uVar3;
      if ((psVar1->pwt).chroma_weight_l0_flag[local_34] != 0) {
        for (local_38 = 0; local_38 < 2; local_38 = local_38 + 1) {
          iVar4 = bs_read_se(b);
          (psVar1->pwt).chroma_weight_l0[local_34][local_38] = iVar4;
          iVar4 = bs_read_se(b);
          (psVar1->pwt).chroma_offset_l0[local_34][local_38] = iVar4;
        }
      }
    }
  }
  iVar5 = is_slice_type(psVar1->slice_type,1);
  if (iVar5 != 0) {
    for (local_34 = 0; local_34 <= psVar1->num_ref_idx_l1_active_minus1; local_34 = local_34 + 1) {
      uVar3 = bs_read_u1(b);
      (psVar1->pwt).luma_weight_l1_flag[local_34] = uVar3;
      if ((psVar1->pwt).luma_weight_l1_flag[local_34] != 0) {
        iVar4 = bs_read_se(b);
        (psVar1->pwt).luma_weight_l1[local_34] = iVar4;
        iVar4 = bs_read_se(b);
        (psVar1->pwt).luma_offset_l1[local_34] = iVar4;
      }
      if (psVar2->ChromaArrayType != 0) {
        uVar3 = bs_read_u1(b);
        (psVar1->pwt).chroma_weight_l1_flag[local_34] = uVar3;
        if ((psVar1->pwt).chroma_weight_l1_flag[local_34] != 0) {
          for (local_38 = 0; local_38 < 2; local_38 = local_38 + 1) {
            iVar4 = bs_read_se(b);
            (psVar1->pwt).chroma_weight_l1[local_34][local_38] = iVar4;
            iVar4 = bs_read_se(b);
            (psVar1->pwt).chroma_offset_l1[local_34][local_38] = iVar4;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void read_pred_weight_table(h264_stream_t* h, bs_t* b)
{
    slice_header_t* sh = h->sh;
    sps_t* sps = h->sps;
    pps_t* pps = h->pps;

    int i, j;

    sh->pwt.luma_log2_weight_denom = bs_read_ue(b);
    if( sps->ChromaArrayType != 0 )
    {
        sh->pwt.chroma_log2_weight_denom = bs_read_ue(b);
    }
    for( i = 0; i <= sh->num_ref_idx_l0_active_minus1; i++ )
    {
        sh->pwt.luma_weight_l0_flag[i] = bs_read_u1(b);
        if( sh->pwt.luma_weight_l0_flag[i] )
        {
            sh->pwt.luma_weight_l0[ i ] = bs_read_se(b);
            sh->pwt.luma_offset_l0[ i ] = bs_read_se(b);
        }
        if ( sps->ChromaArrayType != 0 )
        {
            sh->pwt.chroma_weight_l0_flag[i] = bs_read_u1(b);
            if( sh->pwt.chroma_weight_l0_flag[i] )
            {
                for( j =0; j < 2; j++ )
                {
                    sh->pwt.chroma_weight_l0[ i ][ j ] = bs_read_se(b);
                    sh->pwt.chroma_offset_l0[ i ][ j ] = bs_read_se(b);
                }
            }
        }
    }
    if( is_slice_type( sh->slice_type, SH_SLICE_TYPE_B ) )
    {
        for( i = 0; i <= sh->num_ref_idx_l1_active_minus1; i++ )
        {
            sh->pwt.luma_weight_l1_flag[i] = bs_read_u1(b);
            if( sh->pwt.luma_weight_l1_flag[i] )
            {
                sh->pwt.luma_weight_l1[ i ] = bs_read_se(b);
                sh->pwt.luma_offset_l1[ i ] = bs_read_se(b);
            }
            if( sps->ChromaArrayType != 0 )
            {
                sh->pwt.chroma_weight_l1_flag[i] = bs_read_u1(b);
                if( sh->pwt.chroma_weight_l1_flag[i] )
                {
                    for( j = 0; j < 2; j++ )
                    {
                        sh->pwt.chroma_weight_l1[ i ][ j ] = bs_read_se(b);
                        sh->pwt.chroma_offset_l1[ i ][ j ] = bs_read_se(b);
                    }
                }
            }
        }
    }
}